

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# info.cpp
# Opt level: O3

void __thiscall
setup::info::load_entries<setup::language_entry>
          (info *this,istream *is,entry_types entries,size_t count,
          vector<setup::language_entry,_std::allocator<setup::language_entry>_> *result,
          enum_type entry_type)

{
  pointer plVar1;
  pointer plVar2;
  pointer this_00;
  long lVar3;
  language_entry entry;
  language_entry local_1a8;
  
  plVar1 = (result->
           super__Vector_base<setup::language_entry,_std::allocator<setup::language_entry>_>).
           _M_impl.super__Vector_impl_data._M_start;
  plVar2 = (result->
           super__Vector_base<setup::language_entry,_std::allocator<setup::language_entry>_>).
           _M_impl.super__Vector_impl_data._M_finish;
  this_00 = plVar1;
  if (plVar2 != plVar1) {
    do {
      language_entry::~language_entry(this_00);
      this_00 = this_00 + 1;
    } while (this_00 != plVar2);
    (result->super__Vector_base<setup::language_entry,_std::allocator<setup::language_entry>_>).
    _M_impl.super__Vector_impl_data._M_finish = plVar1;
  }
  if (NoUnknownVersion < entry_type) {
    std::__throw_out_of_range_fmt
              ("%s: __position (which is %zu) >= _Nb (which is %zu)","bitset::set",(ulong)entry_type
               ,0x15);
  }
  if (((ulong)entries._flags.super__Base_bitset<1UL>._M_w >> ((ulong)entry_type & 0x3f) & 1) == 0) {
    if (count != 0) {
      do {
        local_1a8.name._M_dataplus._M_p = (pointer)&local_1a8.name.field_2;
        local_1a8.name._M_string_length = 0;
        local_1a8.name.field_2._M_local_buf[0] = '\0';
        local_1a8.language_name._M_dataplus._M_p = (pointer)&local_1a8.language_name.field_2;
        local_1a8.language_name._M_string_length = 0;
        local_1a8.language_name.field_2._M_local_buf[0] = '\0';
        local_1a8.dialog_font._M_dataplus._M_p = (pointer)&local_1a8.dialog_font.field_2;
        local_1a8.dialog_font._M_string_length = 0;
        local_1a8.dialog_font.field_2._M_local_buf[0] = '\0';
        local_1a8.title_font._M_dataplus._M_p = (pointer)&local_1a8.title_font.field_2;
        local_1a8.title_font._M_string_length = 0;
        local_1a8.title_font.field_2._M_local_buf[0] = '\0';
        local_1a8.welcome_font._M_dataplus._M_p = (pointer)&local_1a8.welcome_font.field_2;
        local_1a8.welcome_font._M_string_length = 0;
        local_1a8.welcome_font.field_2._M_local_buf[0] = '\0';
        local_1a8.copyright_font._M_dataplus._M_p = (pointer)&local_1a8.copyright_font.field_2;
        local_1a8.copyright_font._M_string_length = 0;
        local_1a8.copyright_font.field_2._M_local_buf[0] = '\0';
        local_1a8.data._M_dataplus._M_p = (pointer)&local_1a8.data.field_2;
        local_1a8.data._M_string_length = 0;
        local_1a8.data.field_2._M_local_buf[0] = '\0';
        local_1a8.license_text._M_dataplus._M_p = (pointer)&local_1a8.license_text.field_2;
        local_1a8.license_text._M_string_length = 0;
        local_1a8.license_text.field_2._M_local_buf[0] = '\0';
        local_1a8.info_before._M_dataplus._M_p = (pointer)&local_1a8.info_before.field_2;
        local_1a8.info_before._M_string_length = 0;
        local_1a8.info_before.field_2._M_local_buf[0] = '\0';
        local_1a8.info_after._M_string_length = 0;
        local_1a8.info_after.field_2._M_local_buf[0] = '\0';
        local_1a8.info_after._M_dataplus._M_p = (pointer)&local_1a8.info_after.field_2;
        language_entry::load(&local_1a8,is,this);
        language_entry::~language_entry(&local_1a8);
        count = count - 1;
      } while (count != 0);
    }
  }
  else {
    std::vector<setup::language_entry,_std::allocator<setup::language_entry>_>::resize(result,count)
    ;
    if (count != 0) {
      lVar3 = 0;
      do {
        language_entry::load
                  ((language_entry *)
                   ((long)&(((result->
                             super__Vector_base<setup::language_entry,_std::allocator<setup::language_entry>_>
                             )._M_impl.super__Vector_impl_data._M_start)->name)._M_dataplus._M_p +
                   lVar3),is,this);
        lVar3 = lVar3 + 0x178;
        count = count - 1;
      } while (count != 0);
    }
  }
  return;
}

Assistant:

void info::load_entries(std::istream & is, entry_types entries, size_t count,
                        std::vector<Entry> & result, entry_types::enum_type entry_type) {
	
	result.clear();
	if(entries & entry_type) {
		result.resize(count);
		for(size_t i = 0; i < count; i++) {
			result[i].load(is, *this);
		}
	} else {
		for(size_t i = 0; i < count; i++) {
			Entry entry;
			entry.load(is, *this);
		}
	}
}